

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void add_declaration(Grammar *g,char *start,char *end,uint kind,uint line)

{
  char *pcVar1;
  Elem *e;
  uint line_local;
  uint kind_local;
  char *end_local;
  char *start_local;
  Grammar *g_local;
  
  if (start == end) {
    switch(kind) {
    case 0:
      g->tokenizer = 1;
      break;
    case 1:
      g->longest_match = 1;
      break;
    case 2:
      g->longest_match = 0;
      break;
    case 3:
      g->set_op_priority_from_rule = 1;
      return;
    case 4:
      g->states_for_all_nterms = 1;
      return;
    default:
      d_fail("declare expects argument, line %d",(ulong)line);
      break;
    case 7:
      g->save_parse_tree = 1;
      return;
    }
  }
  if (kind == 3) {
    d_fail("declare does not expect argument, line %d",(ulong)line);
  }
  else if (kind == 6) {
    pcVar1 = dup_str(start,end);
    g->default_white_space = pcVar1;
    return;
  }
  e = new_ident(start,end,(Rule *)0x0);
  new_declaration(g,e,kind);
  return;
}

Assistant:

void add_declaration(Grammar *g, char *start, char *end, uint kind, uint line) {
  if (start == end) {
    switch (kind) {
      case DECLARE_SET_OP_PRIORITY:
        g->set_op_priority_from_rule = 1;
        return;
      case DECLARE_STATES_FOR_ALL_NTERMS:
        g->states_for_all_nterms = 1;
        return;
      case DECLARE_LONGEST_MATCH:
        g->longest_match = 1;
        break;
      case DECLARE_ALL_MATCHES:
        g->longest_match = 0;
        break;
      case DECLARE_TOKENIZE:
        g->tokenizer = 1;
        break;
      case DECLARE_SAVE_PARSE_TREE:
        g->save_parse_tree = 1;
        return;
      default:
        d_fail("declare expects argument, line %d", line);
    }
  }
  switch (kind) {
    case DECLARE_WHITESPACE:
      g->default_white_space = dup_str(start, end);
      return;
    case DECLARE_SET_OP_PRIORITY:
      d_fail("declare does not expect argument, line %d", line);
    default:
      new_declaration(g, new_ident(start, end, NULL), kind);
      break;
  }
}